

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

void add_one_and_zeros_padding(uchar *output,size_t output_len,size_t data_len)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  output[data_len] = 0x80;
  if (1 < output_len - data_len) {
    uVar2 = 1;
    uVar3 = 2;
    do {
      output[uVar2 + data_len] = '\0';
      bVar1 = uVar3 < output_len - data_len;
      uVar2 = uVar3;
      uVar3 = (ulong)(byte)((char)uVar3 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

static void add_one_and_zeros_padding( unsigned char *output,
                                       size_t output_len, size_t data_len )
{
    size_t padding_len = output_len - data_len;
    unsigned char i = 0;

    output[data_len] = 0x80;
    for( i = 1; i < padding_len; i++ )
        output[data_len + i] = 0x00;
}